

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcICheck.c
# Opt level: O0

Vec_Int_t *
Bmc_PerformISearch(Gia_Man_t *p,int nFramesMax,int nTimeOut,int fReverse,int fBackTopo,int fDump,
                  int fVerbose)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  char *pcVar5;
  char *pcVar6;
  uint local_4c;
  int local_48;
  int nLitsUsed;
  int f;
  int i;
  Vec_Int_t *vFlops;
  Vec_Int_t *vLits;
  int fDump_local;
  int fBackTopo_local;
  int fReverse_local;
  int nTimeOut_local;
  int nFramesMax_local;
  Gia_Man_t *p_local;
  
  if (fVerbose != 0) {
    pcVar4 = Gia_ManName(p);
    uVar1 = Gia_ManAndNum(p);
    uVar2 = Gia_ManRegNum(p);
    pcVar5 = "direct";
    if (fReverse != 0) {
      pcVar5 = "reverse";
    }
    pcVar6 = "natural";
    if (fBackTopo != 0) {
      pcVar6 = "backward";
    }
    printf("Solving M-inductiveness for design %s with %d AND nodes and %d flip-flops with %s %s flop order:\n"
           ,pcVar4,(ulong)uVar1,(ulong)uVar2,pcVar5,pcVar6);
  }
  fflush(_stdout);
  iVar3 = Gia_ManCoNum(p);
  p_00 = Vec_IntAlloc(iVar3);
  for (nLitsUsed = 0; iVar3 = Gia_ManRegNum(p), nLitsUsed < iVar3; nLitsUsed = nLitsUsed + 1) {
    iVar3 = Abc_Var2Lit(nLitsUsed,0);
    Vec_IntPush(p_00,iVar3);
  }
  local_48 = 1;
  while( true ) {
    if (nFramesMax < local_48) {
      if (fDump != 0) {
        local_4c = 0;
        for (nLitsUsed = 0; iVar3 = Gia_ManRegNum(p), nLitsUsed < iVar3; nLitsUsed = nLitsUsed + 1)
        {
          iVar3 = Vec_IntEntry(p_00,nLitsUsed);
          iVar3 = Abc_LitIsCompl(iVar3);
          if (iVar3 == 0) {
            local_4c = local_4c + 1;
          }
        }
        uVar1 = Gia_ManRegNum(p);
        printf("The set contains %d (out of %d) next-state functions with 0-based numbers:\n",
               (ulong)local_4c,(ulong)uVar1);
        for (nLitsUsed = 0; iVar3 = Gia_ManRegNum(p), nLitsUsed < iVar3; nLitsUsed = nLitsUsed + 1)
        {
          iVar3 = Vec_IntEntry(p_00,nLitsUsed);
          iVar3 = Abc_LitIsCompl(iVar3);
          if (iVar3 == 0) {
            printf("%d ",(ulong)(uint)nLitsUsed);
          }
        }
        printf("\n");
      }
      iVar3 = Gia_ManRegNum(p);
      p_01 = Vec_IntAlloc(iVar3);
      for (nLitsUsed = 0; iVar3 = Gia_ManRegNum(p), nLitsUsed < iVar3; nLitsUsed = nLitsUsed + 1) {
        iVar3 = Vec_IntEntry(p_00,nLitsUsed);
        iVar3 = Abc_LitIsCompl(iVar3);
        if (iVar3 == 0) {
          Vec_IntPush(p_01,1);
        }
        else {
          Vec_IntPush(p_01,0);
        }
      }
      Vec_IntFree(p_00);
      return p_01;
    }
    iVar3 = Bmc_PerformISearchOne(p,local_48,nTimeOut,fReverse,fBackTopo,fVerbose,p_00);
    if (iVar3 != 0) break;
    local_48 = local_48 + 1;
  }
  Vec_IntFree(p_00);
  return (Vec_Int_t *)0x0;
}

Assistant:

Vec_Int_t * Bmc_PerformISearch( Gia_Man_t * p, int nFramesMax, int nTimeOut, int fReverse, int fBackTopo, int fDump, int fVerbose )
{
    Vec_Int_t * vLits, * vFlops;
    int i, f;
    if ( fVerbose )
    printf( "Solving M-inductiveness for design %s with %d AND nodes and %d flip-flops with %s %s flop order:\n",
        Gia_ManName(p), Gia_ManAndNum(p), Gia_ManRegNum(p), fReverse ? "reverse":"direct", fBackTopo ? "backward":"natural" );
    fflush( stdout );

    // collect positive literals
    vLits = Vec_IntAlloc( Gia_ManCoNum(p) );
    for ( i = 0; i < Gia_ManRegNum(p); i++ )
        Vec_IntPush( vLits, Abc_Var2Lit(i, 0) );

    for ( f = 1; f <= nFramesMax; f++ )
        if ( Bmc_PerformISearchOne( p, f, nTimeOut, fReverse, fBackTopo, fVerbose, vLits ) )
        {
            Vec_IntFree( vLits );
            return NULL;
        }

    // dump the numbers of the flops
    if ( fDump )
    {
        int nLitsUsed = 0;
        for ( i = 0; i < Gia_ManRegNum(p); i++ )
            if ( !Abc_LitIsCompl(Vec_IntEntry(vLits, i)) )
                nLitsUsed++;
        printf( "The set contains %d (out of %d) next-state functions with 0-based numbers:\n", nLitsUsed, Gia_ManRegNum(p) );
        for ( i = 0; i < Gia_ManRegNum(p); i++ )
            if ( !Abc_LitIsCompl(Vec_IntEntry(vLits, i)) )
                printf( "%d ", i );
        printf( "\n" );
    }       
    // save flop indexes
    vFlops = Vec_IntAlloc( Gia_ManRegNum(p) );
    for ( i = 0; i < Gia_ManRegNum(p); i++ )
        if ( !Abc_LitIsCompl(Vec_IntEntry(vLits, i)) )
            Vec_IntPush( vFlops, 1 );
        else
            Vec_IntPush( vFlops, 0 );
    Vec_IntFree( vLits );
    return vFlops;
}